

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O0

RTMatrix4x4 * __thiscall
RTMatrix4x4::inverted(RTMatrix4x4 *__return_storage_ptr__,RTMatrix4x4 *this)

{
  RTFLOAT RVar1;
  RTFLOAT RVar2;
  int local_1c;
  int local_18;
  int col;
  int row;
  RTFLOAT det;
  RTMatrix4x4 *this_local;
  
  RTMatrix4x4(__return_storage_ptr__);
  RVar1 = matDet(this);
  if ((RVar1 != 0.0) || (NAN(RVar1))) {
    for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
      for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
        if ((local_18 + local_1c & 1U) == 0) {
          RVar2 = matMinor(this,local_18,local_1c);
          __return_storage_ptr__->m_data[local_1c][local_18] = RVar2 / RVar1;
        }
        else {
          RVar2 = matMinor(this,local_18,local_1c);
          __return_storage_ptr__->m_data[local_1c][local_18] = -RVar2 / RVar1;
        }
      }
    }
  }
  else {
    setToIdentity(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

RTMatrix4x4 RTMatrix4x4::inverted()
{
    RTMatrix4x4 res;

    RTFLOAT det = matDet();

    if (det == 0) {
        res.setToIdentity();
        return res;
    }

    for (int row = 0; row < 4; row++) {
        for (int col = 0; col < 4; col++) {
            if ((row + col) & 1)
                res.m_data[col][row] = -matMinor(row, col) / det;
            else
                res.m_data[col][row] = matMinor(row, col) / det;
        }
    }

    return res;
}